

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detection.cpp
# Opt level: O1

vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
* pobr::imgProcessing::utils::detection::groupLetters
            (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             *__return_storage_ptr__,
            vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            *segments)

{
  value_type *pvVar1;
  Segment *pSVar2;
  pointer pSVar3;
  bool bVar4;
  int iVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  long lVar8;
  Segment *pSVar9;
  value_type *this;
  pointer pSVar10;
  Segment *this_00;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *this_01;
  Segment *this_02;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  pair<double,_double> pVar19;
  pair<double,_double> pVar20;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersO;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersC;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersS;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersE;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  lettersT;
  string classification;
  Segment segmentC;
  Segment segmentS;
  double local_328;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  local_2d8;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  local_2b8;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  local_298;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  local_278;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  local_258;
  Segment *local_240;
  undefined1 local_238 [32];
  uint local_218 [24];
  value_type local_1b8;
  Segment local_138;
  Segment local_b8;
  
  (__return_storage_ptr__->
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
  local_258.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
  local_278.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
  local_278.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
  local_298.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
  local_298.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
  local_2b8.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
  local_2b8.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
  local_2d8.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
  local_2d8.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
  this = (segments->
         super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (segments->
           super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (this != pvVar1) {
    do {
      structs::Segment::classify_abi_cxx11_((string *)local_238,this);
      iVar5 = std::__cxx11::string::compare((char *)local_238);
      this_01 = &local_258;
      if (iVar5 == 0) {
LAB_001078cc:
        std::
        vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
        ::push_back(this_01,this);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)local_238);
        this_01 = &local_278;
        if (iVar5 == 0) goto LAB_001078cc;
        iVar5 = std::__cxx11::string::compare((char *)local_238);
        this_01 = &local_298;
        if (iVar5 == 0) goto LAB_001078cc;
        iVar5 = std::__cxx11::string::compare((char *)local_238);
        this_01 = &local_2b8;
        if (iVar5 == 0) goto LAB_001078cc;
        iVar5 = std::__cxx11::string::compare((char *)local_238);
        this_01 = &local_2d8;
        if (iVar5 == 0) goto LAB_001078cc;
      }
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_);
      }
      this = this + 1;
    } while (this != pvVar1);
  }
  local_240 = local_258.
              super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = local_2d8.
            super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = local_2d8.
           super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_02 = local_258.
            super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_258.
      super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_258.
      super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      for (; this_00 != pSVar2; this_00 = this_00 + 1) {
        pVar19 = structs::Segment::getGlobalCenter(this_02);
        dVar16 = pVar19.second;
        dVar14 = pVar19.first;
        pVar19 = structs::Segment::getGlobalCenter(this_00);
        if (dVar14 <= pVar19.first) {
          dVar11 = structs::Segment::getDistance(this_02,this_00);
          uVar6 = structs::Segment::getWidth(this_02);
          uVar7 = structs::Segment::getWidth(this_00);
          lVar8 = uVar7 + uVar6;
          auVar15._8_4_ = (int)((ulong)lVar8 >> 0x20);
          auVar15._0_8_ = lVar8;
          auVar15._12_4_ = 0x45300000;
          dVar11 = dVar11 / (((auVar15._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) * 0.5 *
                            4.0);
          if ((0.8 <= dVar11) && (dVar11 <= 1.2)) {
            local_238._16_8_ = 0;
            local_238._24_8_ = 0;
            local_238._0_8_ = (pointer)0x0;
            local_238._8_8_ = 0;
            cv::Mat::Mat((Mat *)local_218);
            local_218[0] = local_218[0] & 0xfffff000 | 0x10;
            local_b8.yMin = 0;
            local_b8.yMax = 0;
            local_b8.xMin = 0;
            local_b8.xMax = 0;
            cv::Mat::Mat(&local_b8.pixels.super_Mat);
            local_b8.pixels._0_4_ = local_b8.pixels._0_4_ & 0xfffff000 | 0x10;
            local_138.yMin = 0;
            local_138.yMax = 0;
            local_138.xMin = 0;
            local_138.xMax = 0;
            cv::Mat::Mat(&local_138.pixels.super_Mat);
            pSVar3 = local_278.
                     super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_138.pixels._0_4_ = local_138.pixels._0_4_ & 0xfffff000 | 0x10;
            dVar11 = (pVar19.second - dVar16) * 0.25;
            local_328 = -1.5;
            if (dVar11 <= 0.0) {
              local_328 = 1.5;
            }
            dVar18 = 1.5;
            if (dVar11 <= 0.0) {
              dVar18 = -1.5;
            }
            dVar17 = (pVar19.first - dVar14) * 0.25;
            local_328 = local_328 *
                        (*(double *)(&DAT_00110790 + (ulong)(0.0 < dVar11) * 8) + dVar11);
            dVar18 = (*(double *)(&DAT_00110790 + (ulong)(0.0 < dVar11) * 8) + dVar11) * dVar18;
            if (local_278.
                super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_278.
                super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              dVar12 = dVar17 * 0.0 + dVar14;
              dVar13 = dVar11 * 0.0 + dVar16;
              pSVar10 = local_278.
                        super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                pVar20 = structs::Segment::getGlobalCenter(pSVar10);
                if ((((dVar17 * -1.5 + dVar12 <= pVar20.first) &&
                     (pVar20.first <= dVar17 * 1.5 + dVar12)) &&
                    (local_328 + dVar13 <= pVar20.second)) && (pVar20.second <= dVar13 + dVar18)) {
                  local_238._0_8_ = pSVar10->xMin;
                  local_238._8_8_ = pSVar10->xMax;
                  local_238._16_8_ = pSVar10->yMin;
                  local_238._24_8_ = pSVar10->yMax;
                  cv::Mat::operator=((Mat *)local_218,&(pSVar10->pixels).super_Mat);
                  break;
                }
                pSVar10 = pSVar10 + 1;
              } while (pSVar10 != pSVar3);
            }
            bVar4 = structs::Segment::isValid((Segment *)local_238);
            pSVar3 = local_298.
                     super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (bVar4) {
              if (local_298.
                  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_298.
                  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pSVar10 = local_298.
                          super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  pVar20 = structs::Segment::getGlobalCenter(pSVar10);
                  if (((dVar17 * -1.5 + dVar14 + dVar17 <= pVar20.first) &&
                      (pVar20.first <= dVar17 * 1.5 + dVar14 + dVar17)) &&
                     ((local_328 + dVar16 + dVar11 <= pVar20.second &&
                      (pVar20.second <= dVar16 + dVar11 + dVar18)))) {
                    local_b8.xMin = pSVar10->xMin;
                    local_b8.xMax = pSVar10->xMax;
                    local_b8.yMin = pSVar10->yMin;
                    local_b8.yMax = pSVar10->yMax;
                    cv::Mat::operator=(&local_b8.pixels.super_Mat,&(pSVar10->pixels).super_Mat);
                    break;
                  }
                  pSVar10 = pSVar10 + 1;
                } while (pSVar10 != pSVar3);
              }
              bVar4 = structs::Segment::isValid(&local_b8);
              pSVar3 = local_2b8.
                       super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (bVar4) {
                if (local_2b8.
                    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    local_2b8.
                    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  dVar14 = dVar17 + dVar17 + dVar14;
                  dVar11 = dVar11 + dVar11 + dVar16;
                  pSVar10 = local_2b8.
                            super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    pVar20 = structs::Segment::getGlobalCenter(pSVar10);
                    if (((dVar17 * -1.5 + dVar14 <= pVar20.first) &&
                        (pVar20.first <= dVar17 * 1.5 + dVar14)) &&
                       ((local_328 + dVar11 <= pVar20.second && (pVar20.second <= dVar18 + dVar11)))
                       ) {
                      local_138.xMin = pSVar10->xMin;
                      local_138.xMax = pSVar10->xMax;
                      local_138.yMin = pSVar10->yMin;
                      local_138.yMax = pSVar10->yMax;
                      cv::Mat::operator=(&local_138.pixels.super_Mat,&(pSVar10->pixels).super_Mat);
                      break;
                    }
                    pSVar10 = pSVar10 + 1;
                  } while (pSVar10 != pSVar3);
                }
                bVar4 = structs::Segment::isValid(&local_138);
                if (bVar4) {
                  local_1b8.yMin = 0;
                  local_1b8.yMax = 0;
                  local_1b8.xMin = 0;
                  local_1b8.xMax = 0;
                  cv::Mat::Mat(&local_1b8.pixels.super_Mat);
                  local_1b8.pixels._0_4_ = local_1b8.pixels._0_4_ & 0xfffff000 | 0x10;
                  local_1b8.xMin = this_02->xMin;
                  local_1b8.xMax = this_00->xMax;
                  if (pVar19.second <= dVar16) {
                    local_1b8.yMin = this_00->yMin;
                    pSVar9 = this_02;
                  }
                  else {
                    local_1b8.yMin = this_02->yMin;
                    pSVar9 = this_00;
                  }
                  local_1b8.yMax = pSVar9->yMax;
                  std::
                  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                  ::push_back(__return_storage_ptr__,&local_1b8);
                  cv::Mat::~Mat(&local_1b8.pixels.super_Mat);
                }
              }
            }
            cv::Mat::~Mat(&local_138.pixels.super_Mat);
            cv::Mat::~Mat(&local_b8.pixels.super_Mat);
            cv::Mat::~Mat((Mat *)local_218);
          }
        }
      }
      this_02 = this_02 + 1;
      this_00 = local_2d8.
                super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar2 = local_2d8.
               super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (this_02 != local_240);
  }
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&local_2d8);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&local_2b8);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&local_298);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&local_278);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&local_258);
  return __return_storage_ptr__;
}

Assistant:

std::vector<structs::Segment> 
detection::groupLetters(
    const std::vector<structs::Segment>& segments
)
{
    std::vector<structs::Segment> boundingBoxes;

    std::vector<structs::Segment> lettersT;
    std::vector<structs::Segment> lettersE;
    std::vector<structs::Segment> lettersS;
    std::vector<structs::Segment> lettersC;
    std::vector<structs::Segment> lettersO;

    for (const auto& segment: segments) {
        const auto classification = segment.classify();

        if (classification == "LETTER_T") {
            lettersT.push_back(segment);
            continue;
        }
        if (classification == "LETTER_E") {
            lettersE.push_back(segment);
            continue;
        }
        if (classification == "LETTER_S") {
            lettersS.push_back(segment);
            continue;
        }
        if (classification == "LETTER_C") {
            lettersC.push_back(segment);
            continue;
        }
        if (classification == "LETTER_O") {
            lettersO.push_back(segment);
            continue;
        }
    }

    for (const auto& segmentT: lettersT) {
        for (const auto& segmentO: lettersO) {
            // Do not detect mirrored images
            const auto tGlobalCenter = segmentT.getGlobalCenter();
            const auto oGlobalCenter = segmentO.getGlobalCenter();

            if (tGlobalCenter.first - oGlobalCenter.first > 0) {
                continue;
            }

            const auto distance = structs::Segment::getDistance(segmentT, segmentO);
            const auto avgWidth = ((double) (segmentT.getWidth() + segmentO.getWidth())) / 2;
            const auto expectedDistance = avgWidth * 4;

            const auto ratio = distance / expectedDistance;

            // If distance seems too long or too short, skip it
            if (ratio < 0.8 || ratio > 1.2) {
                continue;
            }

            // Interpolate possible places for next letters
            structs::Segment segmentE;
            structs::Segment segmentS;
            structs::Segment segmentC;

            const auto xDiff = ((double) (oGlobalCenter.first - tGlobalCenter.first)) / 4;
            const auto yDiff = ((double) (oGlobalCenter.second - tGlobalCenter.second)) / 4;

            // - Find letter E
            {
                const auto expectedCenterXMin = tGlobalCenter.first + (xDiff * 0) + (xDiff * -1.5); 
                const auto expectedCenterXMax = tGlobalCenter.first + (xDiff * 0) + (xDiff * 1.5); 
                const auto expectedCenterYMin = tGlobalCenter.second + (yDiff * 0) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? -1.5 : 1.5)); 
                const auto expectedCenterYMax = tGlobalCenter.second + (yDiff * 0) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? 1.5 : -1.5)); 

                for (const auto& thisSegment: lettersE) {
                    const auto thisGlobalCenter = thisSegment.getGlobalCenter();

                    if (thisGlobalCenter.first < expectedCenterXMin) {
                        continue;
                    }
                    if (thisGlobalCenter.first > expectedCenterXMax) {
                        continue;
                    }
                    if (thisGlobalCenter.second < expectedCenterYMin) {
                        continue;
                    }
                    if (thisGlobalCenter.second > expectedCenterYMax) {
                        continue;
                    }

                    segmentE = thisSegment;

                    break;
                }

                if (!segmentE.isValid()) {
                    continue;
                }
            }

            // - Find letter S
            {
                const auto expectedCenterXMin = tGlobalCenter.first + (xDiff * 1) + (xDiff * -1.5); 
                const auto expectedCenterXMax = tGlobalCenter.first + (xDiff * 1) + (xDiff * 1.5); 
                const auto expectedCenterYMin = tGlobalCenter.second + (yDiff * 1) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? -1.5 : 1.5)); 
                const auto expectedCenterYMax = tGlobalCenter.second + (yDiff * 1) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? 1.5 : -1.5)); 

                for (const auto& thisSegment: lettersS) {
                    const auto thisGlobalCenter = thisSegment.getGlobalCenter();

                    if (thisGlobalCenter.first < expectedCenterXMin) {
                        continue;
                    }
                    if (thisGlobalCenter.first > expectedCenterXMax) {
                        continue;
                    }
                    if (thisGlobalCenter.second < expectedCenterYMin) {
                        continue;
                    }
                    if (thisGlobalCenter.second > expectedCenterYMax) {
                        continue;
                    }

                    segmentS = thisSegment;

                    break;
                }

                if (!segmentS.isValid()) {
                    continue;
                }
            }

            // - Find letter C
            {
                const auto expectedCenterXMin = tGlobalCenter.first + (xDiff * 2) + (xDiff * -1.5); 
                const auto expectedCenterXMax = tGlobalCenter.first + (xDiff * 2) + (xDiff * 1.5); 
                const auto expectedCenterYMin = tGlobalCenter.second + (yDiff * 2) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? -1.5 : 1.5)); 
                const auto expectedCenterYMax = tGlobalCenter.second + (yDiff * 2) + ((yDiff > 0 ? yDiff + 1 : yDiff - 1) * (yDiff > 0 ? 1.5 : -1.5)); 

                for (const auto& thisSegment: lettersC) {
                    const auto thisGlobalCenter = thisSegment.getGlobalCenter();

                    if (thisGlobalCenter.first < expectedCenterXMin) {
                        continue;
                    }
                    if (thisGlobalCenter.first > expectedCenterXMax) {
                        continue;
                    }
                    if (thisGlobalCenter.second < expectedCenterYMin) {
                        continue;
                    }
                    if (thisGlobalCenter.second > expectedCenterYMax) {
                        continue;
                    }

                    segmentC = thisSegment;

                    break;
                }

                if (!segmentC.isValid()) {
                    continue;
                }
            }

            // Found all letters, store bounding box and skip to next T letter
            structs::Segment bbox;

            bbox.xMin = segmentT.xMin;
            bbox.xMax = segmentO.xMax;

            if (tGlobalCenter.second < oGlobalCenter.second) {
                // Top to bottom
                bbox.yMin = segmentT.yMin;
                bbox.yMax = segmentO.yMax;
            } else {
                // Bottom to top
                bbox.yMin = segmentO.yMin;
                bbox.yMax = segmentT.yMax;
            }

            // Note: possible slight optimisation
            //       remove used letters from containers to prevent re-checking them

            boundingBoxes.push_back(bbox);
        }
    }

    return boundingBoxes;
}